

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

bool dgrminer::is_min_code
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges)

{
  pointer *ppaVar1;
  pointer *ppaVar2;
  vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *this;
  vector<int,std::allocator<int>> *this_00;
  array<int,_10UL> *pattern_edge2;
  mapped_type mVar3;
  iterator iVar4;
  pointer paVar5;
  iterator __position;
  iterator __position_00;
  pointer paVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  iterator __last;
  bool bVar10;
  uint uVar11;
  mapped_type *pmVar12;
  pointer paVar13;
  int *piVar14;
  _Elt_pointer piVar15;
  int iVar16;
  pointer piVar17;
  ulong uVar18;
  long lVar19;
  _Elt_pointer piVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  byte bVar25;
  key_type *__k;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  array<int,_10UL> *paVar29;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  _Var30;
  int i;
  size_type __n;
  array<int,_10UL> newedge;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  vector<bool,_std::allocator<bool>_> selected_edges;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  array<int,_10UL> built_min_code_edge;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  vector<int,_std::allocator<int>_> selected_candidates;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  vector<int,_std::allocator<int>_> selected_edges_ind;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  int local_30c;
  _Deque_base<int,_std::allocator<int>_> local_2f8;
  long local_2a0;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  local_298;
  iterator iStack_290;
  labeled_pattern_edge *local_288;
  undefined4 local_274;
  vector<bool,_std::allocator<bool>_> local_270;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_248;
  long local_230;
  void *local_228;
  iterator iStack_220;
  int *local_218;
  void *local_208;
  iterator iStack_200;
  int *local_1f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1e8;
  labeled_pattern_edge local_1cc;
  ulong local_1a0;
  long local_198;
  long local_190;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  local_188;
  array<int,_10UL> local_170;
  _Deque_base<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_f8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_e0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_b0;
  size_type local_80;
  int *local_78;
  int *local_70;
  size_type local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_2a0 = ((long)(edge_list->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(edge_list->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if (0 < (int)(uint)local_2a0) {
    uVar23 = (ulong)((uint)local_2a0 & 0x7fffffff);
    lVar27 = 0x24;
    do {
      paVar13 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           CONCAT44(*(undefined4 *)((long)paVar13->_M_elems + lVar27 + -0x24),
                    *(undefined4 *)((long)paVar13->_M_elems + lVar27 + -0x20));
      local_2f8._M_impl.super__Deque_impl_data._M_map_size =
           CONCAT44(*(undefined4 *)((long)paVar13->_M_elems + lVar27 + -4),
                    *(undefined4 *)((long)paVar13->_M_elems + lVar27 + -8));
      iVar16 = *(int *)((long)paVar13->_M_elems + lVar27 + -0x14);
      if (iVar16 == 1) {
        iVar16 = 2;
      }
      else if (iVar16 == 2) {
        iVar16 = 1;
      }
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)CONCAT44(*(undefined4 *)((long)paVar13->_M_elems + lVar27 + -0x10),iVar16);
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ =
           *(undefined4 *)((long)paVar13->_M_elems + lVar27 + -0xc);
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
           *(undefined4 *)((long)paVar13->_M_elems + lVar27 + -0x1c);
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ =
           *(undefined4 *)((long)paVar13->_M_elems + lVar27 + -0x18);
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ =
           *(undefined4 *)((long)paVar13->_M_elems + lVar27);
      iVar4._M_current =
           (edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (edge_list->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)edge_list,
                   iVar4,(array<int,_10UL> *)&local_2f8);
      }
      else {
        *(ulong *)((iVar4._M_current)->_M_elems + 8) =
             CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                      local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_);
        *(_Elt_pointer *)((iVar4._M_current)->_M_elems + 4) =
             local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        *(ulong *)((iVar4._M_current)->_M_elems + 6) =
             CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                      local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_);
        *(_Map_pointer *)(iVar4._M_current)->_M_elems =
             local_2f8._M_impl.super__Deque_impl_data._M_map;
        *(size_t *)((iVar4._M_current)->_M_elems + 2) =
             local_2f8._M_impl.super__Deque_impl_data._M_map_size;
        ppaVar1 = &(edge_list->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      lVar27 = lVar27 + 0x28;
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  uVar11 = (uint)((ulong)((long)(starting_edges->
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(starting_edges->
                               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar11) {
    uVar23 = (ulong)(uVar11 & 0x7fffffff);
    lVar27 = 0x1c;
    do {
      paVar5 = (starting_edges->
               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           CONCAT44(*(undefined4 *)((long)paVar5->_M_elems + lVar27 + -4),
                    *(undefined4 *)((long)paVar5->_M_elems + lVar27 + -8));
      iVar16 = *(int *)((long)paVar5->_M_elems + lVar27 + -0x14);
      if (iVar16 == 1) {
        iVar16 = 2;
      }
      else if (iVar16 == 2) {
        iVar16 = 1;
      }
      local_2f8._M_impl.super__Deque_impl_data._M_map_size =
           CONCAT44(*(undefined4 *)((long)paVar5->_M_elems + lVar27 + -0x10),iVar16);
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)
           CONCAT44(*(undefined4 *)((long)paVar5->_M_elems + lVar27 + -0x1c),
                    *(undefined4 *)((long)paVar5->_M_elems + lVar27 + -0xc));
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ =
           *(undefined4 *)((long)paVar5->_M_elems + lVar27 + -0x18);
      local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
           *(undefined4 *)((long)paVar5->_M_elems + lVar27);
      __position._M_current =
           (starting_edges->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (starting_edges->
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
        _M_realloc_insert<std::array<int,8ul>>
                  ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)starting_edges
                   ,__position,(array<int,_8UL> *)&local_2f8);
      }
      else {
        *(_Elt_pointer *)((__position._M_current)->_M_elems + 4) =
             local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        *(ulong *)((__position._M_current)->_M_elems + 6) =
             CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                      local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_);
        *(_Map_pointer *)(__position._M_current)->_M_elems =
             local_2f8._M_impl.super__Deque_impl_data._M_map;
        *(size_t *)((__position._M_current)->_M_elems + 2) =
             local_2f8._M_impl.super__Deque_impl_data._M_map_size;
        ppaVar2 = &(starting_edges->
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      lVar27 = lVar27 + 0x20;
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  find_minimum_labelings(&local_48,edge_list,starting_edges,false);
  local_78 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar10 = true;
  }
  else {
    iVar16 = (int)local_2a0 * 2;
    local_80 = (size_type)iVar16;
    __n = (size_type)(int)local_2a0;
    piVar17 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    local_68 = __n;
    do {
      iVar21 = *piVar17;
      local_170._M_elems[0] = 0;
      local_170._M_elems[1] = 1;
      uVar23 = (ulong)iVar21;
      paVar29 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_170._M_elems[2] = paVar29[uVar23]._M_elems[2];
      local_170._M_elems[3] = paVar29[uVar23]._M_elems[3];
      local_170._M_elems[4] = paVar29[uVar23]._M_elems[4];
      local_170._M_elems[5] = paVar29[uVar23]._M_elems[5];
      local_170._M_elems[6] = paVar29[uVar23]._M_elems[6];
      local_170._M_elems[7] = paVar29[uVar23]._M_elems[7];
      local_170._M_elems[8] = paVar29[uVar23]._M_elems[8];
      local_170._M_elems[9] = paVar29[uVar23]._M_elems[9];
      local_70 = piVar17;
      bVar10 = is_pattern_edge_smaller_than(&local_170,paVar29,true);
      iVar22 = 1;
      if (!bVar10) {
        local_248.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_248.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (array<int,_10UL> *)0x0;
        local_248.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (array<int,_10UL> *)0x0;
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>const&>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)&local_248,
                   (iterator)0x0,&local_170);
        local_2f8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((ulong)local_2f8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_270,local_80,(bool *)&local_2f8,(allocator_type *)&local_148);
        local_2f8._M_impl.super__Deque_impl_data._M_map._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_60,__n,(value_type_conflict1 *)&local_2f8,(allocator_type *)&local_148);
        local_2f8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((ulong)local_2f8._M_impl.super__Deque_impl_data._M_map._4_4_ << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_f8,__n,(value_type_conflict1 *)&local_2f8,(allocator_type *)&local_148);
        local_2f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2f8._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        std::
        vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
        ::vector(&local_188,__n,(value_type *)&local_2f8,(allocator_type *)&local_148);
        if (local_2f8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
          operator_delete(local_2f8._M_impl.super__Deque_impl_data._M_map);
        }
        local_2f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2f8._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector(&local_1e8,__n,(value_type *)&local_2f8,(allocator_type *)&local_148);
        if (local_2f8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
          operator_delete(local_2f8._M_impl.super__Deque_impl_data._M_map);
        }
        *local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar21;
        uVar28 = uVar23 + 0x3f;
        if (-1 < (long)uVar23) {
          uVar28 = uVar23;
        }
        local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar28 >> 6) + ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar28 >> 6) +
              ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)iVar21 & 0x3f);
        iVar21 = ((int)local_2a0 + iVar21) % iVar16;
        uVar18 = (ulong)iVar21;
        uVar28 = uVar18 + 0x3f;
        if (-1 < (long)uVar18) {
          uVar28 = uVar18;
        }
        local_1a0 = 0x800000000000003f;
        local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar28 >> 6) + ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar28 >> 6) +
              ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)iVar21 & 0x3f);
        local_1f8 = (int *)0x0;
        local_208 = (void *)0x0;
        iStack_200._M_current = (int *)0x0;
        local_218 = (int *)0x0;
        local_228 = (void *)0x0;
        iStack_220._M_current = (int *)0x0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_b0._M_impl.super__Rb_tree_header._M_header;
        local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_e0._M_impl.super__Rb_tree_header._M_header;
        local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
        mVar3 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar23]._M_elems[0];
        local_2f8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((ulong)local_2f8._M_impl.super__Deque_impl_data._M_map & 0xffffffff00000000);
        local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_e0,(key_type *)&local_2f8);
        *pmVar12 = mVar3;
        mVar3 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar23]._M_elems[1];
        local_2f8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_map._4_4_,1);
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_e0,(key_type *)&local_2f8);
        *pmVar12 = mVar3;
        paVar13 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar13) {
          lVar27 = 4;
          uVar28 = 0;
          do {
            piVar14 = (int *)((long)paVar13->_M_elems + lVar27 + -4);
            if (iStack_200._M_current == local_1f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_208,iStack_200,piVar14);
            }
            else {
              *iStack_200._M_current = *piVar14;
              iStack_200._M_current = iStack_200._M_current + 1;
            }
            piVar14 = (int *)((long)((edge_list->
                                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar27)
            ;
            if (iStack_220._M_current == local_218) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_228,iStack_220,piVar14);
            }
            else {
              *iStack_220._M_current = *piVar14;
              iStack_220._M_current = iStack_220._M_current + 1;
            }
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_b0,
                                 (key_type *)
                                 ((long)((edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar27 + -4));
            *pmVar12 = 0;
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_b0,
                                 (key_type *)
                                 ((long)((edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar27));
            *pmVar12 = 0;
            uVar28 = uVar28 + 1;
            paVar13 = (edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar18 = ((long)(edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3) *
                     -0x3333333333333333;
            lVar27 = lVar27 + 0x28;
          } while (uVar28 <= uVar18 && uVar18 - uVar28 != 0);
        }
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_b0,paVar13[uVar23]._M_elems);
        *pmVar12 = 1;
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_b0,
                             (edge_list->
                             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar23]._M_elems + 1);
        *pmVar12 = 1;
        local_30c = 1;
        do {
          local_30c = local_30c - (uint)((int)local_2a0 <= local_30c);
          if (local_30c == 0) {
            iVar22 = 0;
            break;
          }
          lVar27 = (long)local_30c;
          if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar27] == 0) {
            find_rightmost_path((deque<int,_std::allocator<int>_> *)&local_2f8,&local_248);
            local_148._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = (mapped_type *)0x0;
            local_148._M_impl.super__Deque_impl_data._M_finish._M_first = (mapped_type *)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            local_148._M_impl.super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_148,0);
            lVar24 = 0;
            for (uVar23 = 0;
                uVar23 < (CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                   local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_)
                          - (long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
                         ((long)local_2f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)local_2f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                         ((((ulong)((long)local_2f8._M_impl.super__Deque_impl_data._M_finish._M_node
                                   - (long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_node
                                   ) >> 3) - 1) +
                         (ulong)(local_2f8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                (_Map_pointer)0x0)) * 0x80; uVar23 = uVar23 + 1) {
              lVar19 = (long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                       CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                                local_2f8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_) >>
                       2;
              uVar28 = uVar23 + lVar19;
              if (uVar28 < 0x80) {
                __k = (key_type *)
                      ((long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar24);
              }
              else {
                uVar18 = uVar28 >> 7 | 0xfe00000000000000;
                if (0 < (long)uVar28) {
                  uVar18 = uVar28 >> 7;
                }
                __k = local_2f8._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                      lVar19 + uVar18 * -0x80 + uVar23;
              }
              pmVar12 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_e0,__k);
              if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_148._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_148,pmVar12);
              }
              else {
                *local_148._M_impl.super__Deque_impl_data._M_finish._M_cur = *pmVar12;
                local_148._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_148._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              lVar24 = lVar24 + 4;
            }
            piVar15 = local_148._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_148._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_148._M_impl.super__Deque_impl_data._M_finish._M_first) {
              piVar15 = local_148._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            iVar21 = piVar15[-1];
            local_298._M_current = (labeled_pattern_edge *)0x0;
            iStack_290._M_current = (labeled_pattern_edge *)0x0;
            local_288 = (labeled_pattern_edge *)0x0;
            uVar23 = 0;
            local_230 = lVar27;
            while( true ) {
              lVar27 = local_230;
              lVar24 = ((long)local_2f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)local_2f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                       ((((ulong)((long)local_2f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                                 (long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_node) >>
                         3) - 1) +
                       (ulong)(local_2f8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                              (_Map_pointer)0x0)) * 0x80;
              lVar19 = CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                local_2f8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_) -
                       (long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2;
              if ((lVar19 + lVar24) - 1U <= uVar23) break;
              uVar28 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)local_148._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                       uVar23;
              if (uVar28 < 0x80) {
                piVar14 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur + uVar23;
              }
              else {
                uVar18 = uVar28 >> 7 | 0xfe00000000000000;
                if (0 < (long)uVar28) {
                  uVar18 = uVar28 >> 7;
                }
                piVar14 = local_148._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                          uVar28 + uVar18 * -0x80;
              }
              if (((long)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                  (ulong)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0)
              {
                iVar22 = *piVar14;
                lVar27 = 9;
                uVar28 = 0;
                do {
                  if ((((local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar28 >> 6] >> (uVar28 & 0x3f) & 1) == 0) &&
                      (*(int *)((long)local_208 + uVar28 * 4) == iVar21)) &&
                     (*(int *)((long)local_228 + uVar28 * 4) == iVar22)) {
                    piVar15 = local_2f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                    if (local_2f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_2f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      piVar15 = local_2f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                0x80;
                    }
                    uVar18 = ((long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                              CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_first.
                                       _4_4_,local_2f8._M_impl.super__Deque_impl_data._M_start.
                                             _M_first._0_4_) >> 2) + uVar23;
                    if (uVar18 < 0x80) {
                      piVar14 = local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar23;
                    }
                    else {
                      uVar26 = uVar18 >> 7 | 0xfe00000000000000;
                      if (0 < (long)uVar18) {
                        uVar26 = uVar18 >> 7;
                      }
                      piVar14 = local_2f8._M_impl.super__Deque_impl_data._M_start._M_node[uVar26] +
                                uVar18 + uVar26 * -0x80;
                    }
                    local_1cc.elements._M_elems[0] = piVar15[-1];
                    local_1cc.elements._M_elems[1] = *piVar14;
                    paVar13 = (edge_list->
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    piVar14 = paVar13->_M_elems + lVar27 + -7;
                    local_1cc.elements._M_elems._8_8_ = *(undefined8 *)piVar14;
                    local_1cc.elements._M_elems._16_8_ = *(undefined8 *)(piVar14 + 2);
                    piVar14 = paVar13->_M_elems + lVar27 + -3;
                    uVar7 = *(undefined8 *)piVar14;
                    uVar8 = *(undefined8 *)(piVar14 + 2);
                    local_1cc.elements._M_elems[6] = (int)uVar7;
                    local_1cc.elements._M_elems[7] = (int)((ulong)uVar7 >> 0x20);
                    local_1cc.elements._M_elems[8] = (int)uVar8;
                    local_1cc.elements._M_elems[9] = (int)((ulong)uVar8 >> 0x20);
                    local_1cc.index = (int)uVar28;
                    if (iStack_290._M_current == local_288) {
                      std::
                      vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                      ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                  *)&local_298,iStack_290,&local_1cc);
                    }
                    else {
                      *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 7) =
                           CONCAT44(local_1cc.elements._M_elems[8],local_1cc.elements._M_elems[7]);
                      *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 9) =
                           CONCAT44(local_1cc.index,local_1cc.elements._M_elems[9]);
                      *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 4) =
                           local_1cc.elements._M_elems._16_8_;
                      *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 6) = uVar7;
                      *(ulong *)((iStack_290._M_current)->elements)._M_elems =
                           CONCAT44(local_1cc.elements._M_elems[1],local_1cc.elements._M_elems[0]);
                      *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 2) =
                           local_1cc.elements._M_elems._8_8_;
                      iStack_290._M_current = iStack_290._M_current + 1;
                    }
                  }
                  uVar28 = uVar28 + 1;
                  lVar27 = lVar27 + 10;
                } while (uVar28 < (ulong)local_270.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_offset +
                                  ((long)local_270.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_p -
                                  (long)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p) * 8);
              }
              uVar23 = uVar23 + 1;
            }
            uVar11 = ((int)lVar24 + (int)lVar19) - 1;
            if (-1 < (int)uVar11) {
              uVar23 = (ulong)uVar11;
              do {
                uVar28 = ((long)local_148._M_impl.super__Deque_impl_data._M_start._M_cur -
                          (long)local_148._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                         uVar23;
                if (uVar28 < 0x80) {
                  piVar14 = local_148._M_impl.super__Deque_impl_data._M_start._M_cur + uVar23;
                }
                else {
                  uVar18 = uVar28 >> 7 | 0xfe00000000000000;
                  if (0 < (long)uVar28) {
                    uVar18 = uVar28 >> 7;
                  }
                  piVar14 = local_148._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                            uVar28 + uVar18 * -0x80;
                }
                if (((long)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (ulong)local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset !=
                    0) {
                  iVar21 = *piVar14;
                  uVar28 = 0;
                  do {
                    if ((((local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar28 >> 6] >> (uVar28 & 0x3f) & 1) == 0) &&
                        (*(int *)((long)local_208 + uVar28 * 4) == iVar21)) &&
                       (pmVar12 = std::
                                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_b0,
                                               (key_type *)(uVar28 * 4 + (long)local_228)),
                       *pmVar12 == 0)) {
                      uVar18 = ((long)local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                                CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_start._M_first.
                                         _4_4_,local_2f8._M_impl.super__Deque_impl_data._M_start.
                                               _M_first._0_4_) >> 2) + uVar23;
                      if (uVar18 < 0x80) {
                        piVar15 = local_2f8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar23;
                      }
                      else {
                        uVar26 = uVar18 >> 7 | 0xfe00000000000000;
                        if (0 < (long)uVar18) {
                          uVar26 = uVar18 >> 7;
                        }
                        piVar15 = local_2f8._M_impl.super__Deque_impl_data._M_start._M_node[uVar26]
                                  + uVar18 + uVar26 * -0x80;
                      }
                      piVar20 = local_2f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_2f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_2f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        piVar20 = local_2f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x80;
                      }
                      local_1cc.elements._M_elems[0] = *piVar15;
                      local_1cc.elements._M_elems[1] = piVar20[-1] + 1;
                      paVar13 = (edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = paVar13[uVar28]._M_elems + 2;
                      local_1cc.elements._M_elems._8_8_ = *(undefined8 *)piVar14;
                      local_1cc.elements._M_elems._16_8_ = *(undefined8 *)(piVar14 + 2);
                      piVar14 = paVar13[uVar28]._M_elems + 6;
                      uVar7 = *(undefined8 *)piVar14;
                      uVar8 = *(undefined8 *)(piVar14 + 2);
                      local_1cc.elements._M_elems[6] = (int)uVar7;
                      local_1cc.elements._M_elems[7] = (int)((ulong)uVar7 >> 0x20);
                      local_1cc.elements._M_elems[8] = (int)uVar8;
                      local_1cc.elements._M_elems[9] = (int)((ulong)uVar8 >> 0x20);
                      local_1cc.index = (int)uVar28;
                      if (iStack_290._M_current == local_288) {
                        std::
                        vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                        ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                  ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                    *)&local_298,iStack_290,&local_1cc);
                      }
                      else {
                        *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 7) =
                             CONCAT44(local_1cc.elements._M_elems[8],local_1cc.elements._M_elems[7])
                        ;
                        *(ulong *)(((iStack_290._M_current)->elements)._M_elems + 9) =
                             CONCAT44(local_1cc.index,local_1cc.elements._M_elems[9]);
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 4) =
                             local_1cc.elements._M_elems._16_8_;
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 6) = uVar7;
                        *(ulong *)((iStack_290._M_current)->elements)._M_elems =
                             CONCAT44(local_1cc.elements._M_elems[1],local_1cc.elements._M_elems[0])
                        ;
                        *(undefined8 *)(((iStack_290._M_current)->elements)._M_elems + 2) =
                             local_1cc.elements._M_elems._8_8_;
                        iStack_290._M_current = iStack_290._M_current + 1;
                      }
                    }
                    uVar28 = uVar28 + 1;
                  } while (uVar28 < (ulong)local_270.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset +
                                    ((long)local_270.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_p -
                                    (long)local_270.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p) * 8);
                }
                bVar10 = 0 < (long)uVar23;
                uVar23 = uVar23 - 1;
              } while (bVar10);
            }
            __last._M_current = iStack_290._M_current;
            _Var30._M_current = local_298._M_current;
            if (local_298._M_current != iStack_290._M_current) {
              uVar23 = ((long)iStack_290._M_current - (long)local_298._M_current >> 2) *
                       0x2e8ba2e8ba2e8ba3;
              lVar24 = 0x3f;
              if (uVar23 != 0) {
                for (; uVar23 >> lVar24 == 0; lVar24 = lVar24 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (local_298,
                         (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                          )iStack_290._M_current,(ulong)(((uint)lVar24 ^ 0x3f) * 2) ^ 0x7e,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x12091f);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (_Var30,(__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                                 )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x12091f);
            }
            paVar13 = local_188.
                      super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar27].
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_188.
                super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar27].
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish != paVar13) {
              local_188.
              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar27].
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = paVar13;
            }
            piVar17 = local_1e8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar27].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            if (local_1e8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar27].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish != piVar17) {
              local_1e8.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar27].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = piVar17;
            }
            _Var30._M_current = local_298._M_current;
            if (iStack_290._M_current != local_298._M_current) {
              lVar24 = 0;
              uVar23 = 0;
              do {
                _Var30._M_current = local_298._M_current;
                if ((uVar23 != 0) &&
                   (bVar10 = is_pattern_edge_smaller_than
                                       ((array<int,_10UL> *)
                                        ((long)local_298._M_current[-1].elements._M_elems + lVar24),
                                        (array<int,_10UL> *)
                                        ((long)((local_298._M_current)->elements)._M_elems + lVar24)
                                        ,true), bVar10)) break;
                this = (vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                       (local_188.
                        super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar27);
                paVar29 = (array<int,_10UL> *)
                          ((long)((_Var30._M_current)->elements)._M_elems + lVar24);
                iVar4._M_current = *(array<int,_10UL> **)(this + 8);
                if (iVar4._M_current == *(array<int,_10UL> **)(this + 0x10)) {
                  std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                  _M_realloc_insert<std::array<int,10ul>const&>(this,iVar4,paVar29);
                }
                else {
                  *(undefined8 *)((iVar4._M_current)->_M_elems + 8) =
                       *(undefined8 *)(paVar29->_M_elems + 8);
                  uVar7 = *(undefined8 *)paVar29->_M_elems;
                  uVar8 = *(undefined8 *)(paVar29->_M_elems + 2);
                  uVar9 = *(undefined8 *)(paVar29->_M_elems + 6);
                  *(undefined8 *)((iVar4._M_current)->_M_elems + 4) =
                       *(undefined8 *)(paVar29->_M_elems + 4);
                  *(undefined8 *)((iVar4._M_current)->_M_elems + 6) = uVar9;
                  *(undefined8 *)(iVar4._M_current)->_M_elems = uVar7;
                  *(undefined8 *)((iVar4._M_current)->_M_elems + 2) = uVar8;
                  *(long *)(this + 8) = *(long *)(this + 8) + 0x28;
                }
                this_00 = (vector<int,std::allocator<int>> *)
                          (local_1e8.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar27);
                piVar14 = (int *)((long)(&(local_298._M_current)->elements + 1) + lVar24);
                __position_00._M_current = *(int **)(this_00 + 8);
                if (__position_00._M_current == *(int **)(this_00 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_00,__position_00,piVar14);
                }
                else {
                  *__position_00._M_current = *piVar14;
                  *(int **)(this_00 + 8) = __position_00._M_current + 1;
                }
                uVar23 = uVar23 + 1;
                lVar24 = lVar24 + 0x2c;
                _Var30._M_current = local_298._M_current;
              } while (uVar23 < (ulong)(((long)iStack_290._M_current - (long)local_298._M_current >>
                                        2) * 0x2e8ba2e8ba2e8ba3));
            }
            if (_Var30._M_current != (labeled_pattern_edge *)0x0) {
              operator_delete(_Var30._M_current);
            }
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_148);
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_2f8);
            lVar27 = local_230;
          }
          uVar28 = (ulong)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar27];
          paVar13 = local_188.
                    super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar27].
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar23 = ((long)local_188.
                          super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar27].
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3) *
                   -0x3333333333333333;
          if (uVar23 < uVar28 || uVar23 - uVar28 == 0) {
            iVar21 = 0x21;
            bVar25 = 0;
          }
          else {
            local_190 = uVar28 * 0x28 + 4;
            local_274 = (undefined4)CONCAT71((int7)((ulong)local_190 >> 8),1);
            do {
              local_198 = uVar28 * 5;
              paVar29 = paVar13 + uVar28;
              paVar6 = (edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pattern_edge2 = paVar6 + lVar27;
              local_230 = lVar27;
              bVar10 = is_pattern_edge_smaller_than(paVar29,pattern_edge2,true);
              lVar24 = local_230;
              if (bVar10) {
                bVar10 = false;
                iVar21 = 1;
              }
              else {
                bVar10 = true;
                if (paVar29->_M_elems[0] == pattern_edge2->_M_elems[0]) {
                  uVar23 = 0;
                  do {
                    uVar18 = uVar23;
                    if (uVar18 == 8) break;
                    uVar23 = uVar18 + 1;
                  } while (*(int *)((long)paVar13->_M_elems + uVar18 * 4 + local_190) ==
                           paVar6[lVar27]._M_elems[uVar18 + 1]);
                  if (7 < uVar18) {
                    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_230] = (int)uVar28 + 1;
                    if (local_248.
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_248.
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                      _M_realloc_insert<std::array<int,10ul>const&>
                                ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>
                                  *)&local_248,
                                 (iterator)
                                 local_248.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,paVar29);
                    }
                    else {
                      *(undefined8 *)
                       ((local_248.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 8) =
                           *(undefined8 *)(paVar29->_M_elems + 8);
                      uVar7 = *(undefined8 *)paVar29->_M_elems;
                      uVar8 = *(undefined8 *)(paVar29->_M_elems + 2);
                      uVar9 = *(undefined8 *)(paVar29->_M_elems + 6);
                      *(undefined8 *)
                       ((local_248.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
                           *(undefined8 *)(paVar29->_M_elems + 4);
                      *(undefined8 *)
                       ((local_248.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) = uVar9;
                      *(undefined8 *)
                       (local_248.
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar7;
                      *(undefined8 *)
                       ((local_248.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) = uVar8;
                      local_248.
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           local_248.
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    lVar27 = local_198;
                    mVar3 = (edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start
                            [local_1e8.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar24].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar28]]._M_elems[0];
                    pmVar12 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_e0,
                                           (local_188.
                                            super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar24].
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                           local_198 * 2);
                    *pmVar12 = mVar3;
                    mVar3 = (edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start
                            [local_1e8.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar24].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar28]]._M_elems[1];
                    pmVar12 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_e0,
                                           (local_188.
                                            super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar24].
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                           lVar27 * 2 + 1);
                    *pmVar12 = mVar3;
                    pmVar12 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_b0,
                                           (edge_list->
                                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start
                                           [local_1e8.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar24].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar28]]._M_elems);
                    *pmVar12 = *pmVar12 + 1;
                    pmVar12 = std::
                              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                            *)&local_b0,
                                           (edge_list->
                                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start
                                           [local_1e8.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar24].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar28]]._M_elems + 1);
                    *pmVar12 = *pmVar12 + 1;
                    iVar21 = local_1e8.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar24].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar28];
                    uVar18 = (ulong)iVar21;
                    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar24] = iVar21;
                    uVar23 = uVar18 + 0x3f;
                    if (-1 < (long)uVar18) {
                      uVar23 = uVar18;
                    }
                    local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar23 >> 6) + ((ulong)((uVar18 & local_1a0) < 0x8000000000000001) - 1)]
                         = local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar23 >> 6) +
                            ((ulong)((uVar18 & local_1a0) < 0x8000000000000001) - 1)] |
                           1L << ((byte)iVar21 & 0x3f);
                    iVar21 = ((int)local_2a0 + iVar21) % iVar16;
                    uVar18 = (ulong)iVar21;
                    uVar23 = uVar18 + 0x3f;
                    if (-1 < (long)uVar18) {
                      uVar23 = uVar18;
                    }
                    local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar23 >> 6) + ((ulong)((uVar18 & local_1a0) < 0x8000000000000001) - 1)]
                         = local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar23 >> 6) +
                            ((ulong)((uVar18 & local_1a0) < 0x8000000000000001) - 1)] |
                           1L << ((byte)iVar21 & 0x3f);
                    local_30c = local_30c + 1;
                    iVar21 = 0x21;
                    bVar10 = false;
                    local_274 = 0;
                    goto LAB_00121add;
                  }
                }
                iVar21 = 0;
              }
LAB_00121add:
              if (!bVar10) goto LAB_00121b30;
              uVar28 = uVar28 + 1;
              lVar27 = (long)local_30c;
              paVar13 = local_188.
                        super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar27].
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar23 = ((long)local_188.
                              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar27].
                              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3) *
                       -0x3333333333333333;
              local_190 = local_190 + 0x28;
            } while (uVar28 <= uVar23 && uVar23 - uVar28 != 0);
            iVar21 = 0x21;
LAB_00121b30:
            bVar25 = (byte)local_274 ^ 1;
          }
          __n = local_68;
          iVar22 = iVar21;
          if (iVar21 == 0x21) {
            iVar22 = 0;
          }
          if (iVar21 == 0x21 && (bVar25 & 1) == 0) {
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_30c] = 0;
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_e0,
                                 local_248.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems);
            local_2f8._M_impl.super__Deque_impl_data._M_map =
                 (_Map_pointer)
                 CONCAT44(local_2f8._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar12);
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_e0,
                                 local_248.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
            local_148._M_impl.super__Deque_impl_data._M_map =
                 (_Map_pointer)
                 CONCAT44(local_148._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar12);
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_b0,(key_type *)&local_2f8);
            *pmVar12 = *pmVar12 + -1;
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_b0,(key_type *)&local_148);
            *pmVar12 = *pmVar12 + -1;
            local_248.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_248.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
            iVar21 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_30c];
            uVar23 = (ulong)iVar21;
            if (uVar23 != 0xffffffffffffffff) {
              uVar28 = uVar23 + 0x3f;
              if (-1 < (long)uVar23) {
                uVar28 = uVar23;
              }
              bVar25 = (byte)iVar21 & 0x3f;
              local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar28 >> 6) + ((ulong)((uVar23 & local_1a0) < 0x8000000000000001) - 1)] =
                   local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar28 >> 6) + ((ulong)((uVar23 & local_1a0) < 0x8000000000000001) - 1)]
                   & (-2L << bVar25 | 0xfffffffffffffffeU >> 0x40 - bVar25);
              iVar21 = ((int)local_2a0 + iVar21) % iVar16;
              uVar28 = (ulong)iVar21;
              uVar23 = uVar28 + 0x3f;
              if (-1 < (long)uVar28) {
                uVar23 = uVar28;
              }
              bVar25 = (byte)iVar21 & 0x3f;
              local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar23 >> 6) + ((ulong)((uVar28 & local_1a0) < 0x8000000000000001) - 1)] =
                   local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar23 >> 6) + ((ulong)((uVar28 & local_1a0) < 0x8000000000000001) - 1)]
                   & (-2L << bVar25 | 0xfffffffffffffffeU >> 0x40 - bVar25);
              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[local_30c] = -1;
            }
            local_30c = local_30c + -1;
            iVar22 = 0;
          }
        } while (iVar22 == 0);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_e0);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_b0);
        if (local_228 != (void *)0x0) {
          operator_delete(local_228);
        }
        if (local_208 != (void *)0x0) {
          operator_delete(local_208);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_1e8);
        std::
        vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
        ::~vector(&local_188);
        if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_270.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        if (local_248.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_248.
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (iVar22 != 0) goto LAB_00121d91;
      piVar17 = local_70 + 1;
    } while (piVar17 != local_78);
    iVar22 = 8;
LAB_00121d91:
    bVar10 = iVar22 == 8;
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

bool is_min_code(std::vector<std::array<int, 10>> edge_list, std::vector<std::array<int, 8>> starting_edges)
    {

        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        int n_starting_edge = starting_edges.size();
        for (int i = 0; i < n_starting_edge; i++)
        {
            starting_edges.push_back(flipAdjacencyInfo(starting_edges[i]));
        }

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, false);


        for (int min_edge_ind : indices_of_min_edges)
        {

            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            if (is_pattern_edge_smaller_than(built_min_code_edge, edge_list[0], true))
            {
                return false;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    current_index--;
                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {
                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};
                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};
                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }

                // try to use the candidates
                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {
                    bool is_smaller = is_pattern_edge_smaller_than(
                            all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true);

                    if (is_smaller)
                    {
                        return false;
                    }
                    if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind],
                                                 edge_list[current_index], true))
                    {
                        // they are same, so append it and move to other edge
                        // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                        selected_candidates[current_index] = edge_candidate_ind + 1;
                        built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                        vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                        vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                        amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                        amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                        int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                        selected_edges_ind[current_index] = sel_e_ind;
                        selected_edges[sel_e_ind] = true;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                        current_index++;
                        should_backtrack = false;
                        break;
                    }
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return true;
    }